

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_pax_truncated.c
# Opt level: O1

void test_read_pax_truncated(void)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  archive *paVar4;
  la_ssize_t lVar5;
  longlong v1;
  wchar_t wVar6;
  longlong lVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  archive_entry *ae;
  size_t used;
  archive_entry *local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  pvVar2 = malloc(1000000);
  local_38 = malloc(1000000);
  pvVar3 = malloc(100000);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'&',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_pax(a)",paVar4);
  iVar1 = archive_write_add_filter_none(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar4);
  local_40 = pvVar2;
  iVar1 = archive_write_open_memory(paVar4,pvVar2,1000000,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buff_size, &used)",paVar4);
  local_58 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'/',(uint)(local_58 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_58,"file");
  archive_entry_set_mode(local_58,0x81ed);
  fill_with_pseudorandom_data(pvVar3,100000);
  uVar10 = 1;
  archive_entry_set_atime(local_58,1,2);
  archive_entry_set_ctime(local_58,3,4);
  archive_entry_set_mtime(local_58,5,6);
  archive_entry_set_size(local_58,100000);
  iVar1 = archive_write_header(paVar4,local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_58);
  local_48 = pvVar3;
  lVar5 = archive_write_data(paVar4,pvVar3,100000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L';',100000,"(int)filedata_size",(long)(int)lVar5,
                      "(int)archive_write_data(a, filedata, filedata_size)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  if ((local_50 & 0xfffffffffffffffe) != 0xffffffffffffff9c) {
    do {
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                       ,L'D',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar4);
      iVar1 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar1 = read_open_memory_minimal(paVar4,local_40,uVar10,0xd);
      lVar7 = (longlong)iVar1;
      if (uVar10 < 0x200) {
        wVar6 = L'I';
        pcVar8 = "read_open_memory_minimal(a, buff, i, 13)";
LAB_001c0e11:
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                            ,wVar6,-0x1e,"ARCHIVE_FATAL",lVar7,pcVar8,paVar4);
      }
      else {
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                            ,L'L',0,"ARCHIVE_OK",lVar7,"read_open_memory_minimal(a, buff, i, 13)",
                            paVar4);
        if (uVar10 < 0x600) {
          iVar1 = archive_read_next_header(paVar4,&local_58);
          lVar7 = (longlong)iVar1;
          wVar6 = L'Q';
          pcVar8 = "archive_read_next_header(a, &ae)";
          goto LAB_001c0e11;
        }
        failure("Archive truncated to %zu bytes",uVar10);
        iVar1 = archive_read_next_header(paVar4,&local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                            ,L'U',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
        if (uVar10 < 0x18ca0) {
          lVar5 = archive_read_data(paVar4,local_48,100000);
          wVar6 = L'Z';
          lVar7 = -0x1e;
          pcVar8 = "ARCHIVE_FATAL";
          pcVar9 = "archive_read_data(a, filedata, filedata_size)";
        }
        else {
          failure("Archive truncated to %zu bytes",uVar10);
          lVar5 = archive_read_data(paVar4,local_48,100000);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                              ,L'_',100000,"filedata_size",lVar5,
                              "archive_read_data(a, filedata, filedata_size)",paVar4);
          if (uVar10 < 0x19000) {
            failure("i=%zu minsize=%zu",uVar10,0x19000);
            iVar1 = archive_read_next_header(paVar4,&local_58);
            wVar6 = L'l';
            lVar7 = -0x1e;
            pcVar8 = "ARCHIVE_FATAL";
          }
          else {
            iVar1 = archive_read_next_header(paVar4,&local_58);
            lVar7 = 1;
            wVar6 = L'o';
            pcVar8 = "ARCHIVE_EOF";
          }
          lVar5 = (la_ssize_t)iVar1;
          pcVar9 = "archive_read_next_header(a, &ae)";
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                            ,wVar6,lVar7,pcVar8,lVar5,pcVar9,paVar4);
      }
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
      iVar1 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      uVar10 = uVar10 + 100;
    } while (uVar10 < local_50 + 100);
  }
  if ((local_50 & 0xfffffffffffffffe) != 0xffffffffffffff9c) {
    uVar10 = 1;
    do {
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                       ,L'z',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar4);
      iVar1 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar1 = read_open_memory(paVar4,local_40,uVar10,7);
      lVar7 = (longlong)iVar1;
      if (uVar10 < 0x200) {
        wVar6 = L'\x7f';
        v1 = -0x1e;
        pcVar8 = "ARCHIVE_FATAL";
        pcVar9 = "read_open_memory(a, buff, i, 7)";
      }
      else {
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                            ,L'\x82',0,"ARCHIVE_OK",lVar7,"read_open_memory(a, buff, i, 7)",paVar4);
        iVar1 = archive_read_next_header(paVar4,&local_58);
        lVar7 = (longlong)iVar1;
        if (uVar10 < 0x600) {
          wVar6 = L'\x86';
LAB_001c1a54:
          v1 = -0x1e;
          pcVar8 = "ARCHIVE_FATAL";
        }
        else {
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                              ,L'\x89',0,"0",lVar7,"archive_read_next_header(a, &ae)",paVar4);
          iVar1 = archive_read_data_skip(paVar4);
          lVar7 = (longlong)iVar1;
          if (uVar10 < 0x18e00) {
            wVar6 = L'\x8d';
            v1 = -0x1e;
            pcVar8 = "ARCHIVE_FATAL";
            pcVar9 = "archive_read_data_skip(a)";
            goto LAB_001c1ac5;
          }
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                              ,L'\x90',0,"ARCHIVE_OK",lVar7,"archive_read_data_skip(a)",paVar4);
          iVar1 = archive_read_next_header(paVar4,&local_58);
          lVar7 = (longlong)iVar1;
          if (uVar10 < 0x19000) {
            wVar6 = L'\x9b';
            goto LAB_001c1a54;
          }
          v1 = 1;
          wVar6 = L'\x9e';
          pcVar8 = "ARCHIVE_EOF";
        }
        pcVar9 = "archive_read_next_header(a, &ae)";
      }
LAB_001c1ac5:
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,wVar6,v1,pcVar8,lVar7,pcVar9,paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'¡',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
      iVar1 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                          ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      uVar10 = uVar10 + 100;
    } while (uVar10 < local_50 + 100);
  }
  pvVar3 = local_38;
  pvVar2 = local_40;
  memcpy(local_38,local_40,1000000);
  *(undefined2 *)((long)pvVar3 + 0x200) = 0x3939;
  *(undefined1 *)((long)pvVar3 + 0x202) = 0x41;
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'¬',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'®',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'°',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'±',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'²',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memcpy(pvVar3,pvVar2,1000000);
  *(undefined1 *)((long)pvVar3 + 0x200) = 0x41;
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'·',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'¸',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'º',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'»',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'¼',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'½',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memcpy(pvVar3,pvVar2,1000000);
  *(undefined8 *)((long)pvVar3 + 0x200) = 0x3939393939393939;
  *(undefined1 *)((long)pvVar3 + 0x208) = 0x20;
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'Ä',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Ç',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'È',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memcpy(pvVar3,pvVar2,1000000);
  *(undefined4 *)((long)pvVar3 + 0x200) = 0x20393939;
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'Ò',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Ó',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Ô',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Õ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Ö',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'×',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'Ø',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memcpy(pvVar3,pvVar2,1000000);
  *(undefined2 *)((long)pvVar3 + 0x200) = 0x2031;
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'Þ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ß',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'à',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'á',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'â',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memcpy(pvVar3,pvVar2,1000000);
  *(undefined1 *)((long)pvVar3 + 0x200) = 0x20;
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'é',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ë',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ì',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'í',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'î',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memcpy(pvVar3,pvVar2,1000000);
  *(char *)((long)pvVar3 + 0x400) = *(char *)((long)pvVar3 + 0x400) + '\x01';
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                   ,L'ô',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'õ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_open_memory(paVar4,pvVar3,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'÷',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff2, used)",
                      paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ø',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_read_next_header(a, &ae)",
                      paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_truncated.c"
                      ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free(pvVar2);
  free(pvVar3);
  free(local_48);
  return;
}

Assistant:

DEFINE_TEST(test_read_pax_truncated)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used, i, buff_size = 1000000;
	size_t filedata_size = 100000;
	char *buff = malloc(buff_size);
	char *buff2 = malloc(buff_size);
	char *filedata = malloc(filedata_size);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_pax(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
			archive_write_open_memory(a, buff, buff_size, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	fill_with_pseudorandom_data(filedata, filedata_size);

	archive_entry_set_atime(ae, 1, 2);
	archive_entry_set_ctime(ae, 3, 4);
	archive_entry_set_mtime(ae, 5, 6);
	archive_entry_set_size(ae, filedata_size);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, (int)filedata_size, 
	    (int)archive_write_data(a, filedata, filedata_size));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Now, read back a truncated version of the archive and
	 * verify that we get an appropriate error. */
	for (i = 1; i < used + 100; i += 100) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		/* If it's truncated very early, the file type detection should fail. */
		if (i < 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, read_open_memory_minimal(a, buff, i, 13));
			goto wrap_up;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, read_open_memory_minimal(a, buff, i, 13));
		}

		/* If it's truncated in a header, the header read should fail. */
		if (i < 1536) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
			goto wrap_up;
		} else {
			failure("Archive truncated to %zu bytes", i);
			assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
		}

		/* If it's truncated in the body, the body read should fail. */
		if (i < 1536 + filedata_size) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data(a, filedata, filedata_size));
			goto wrap_up;
		} else {
			failure("Archive truncated to %zu bytes", i);
			assertEqualIntA(a, filedata_size,
			    archive_read_data(a, filedata, filedata_size));
		}

		/* Verify the end of the archive. */
		/* Archive must be long enough to capture a 512-byte
		 * block of zeroes after the entry.  (POSIX requires a
		 * second block of zeros to be written but libarchive
		 * does not return an error if it can't consume
		 * it.) */
		if (i < 1536 + 512*((filedata_size + 511)/512) + 512) {
			failure("i=%zu minsize=%zu", i,
			    1536 + 512*((filedata_size + 511)/512) + 512);
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_read_next_header(a, &ae));
		} else {
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
		}
	wrap_up:
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}



	/* Same as above, except skip the body instead of reading it. */
	for (i = 1; i < used + 100; i += 100) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		/* If it's truncated very early, file type detection should fail. */
		if (i < 512) {
			assertEqualIntA(a, ARCHIVE_FATAL, read_open_memory(a, buff, i, 7));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, i, 7));
		}

		if (i < 1536) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
		}

		if (i < 1536 + 512*((filedata_size+511)/512)) {
			assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data_skip(a));
			goto wrap_up2;
		} else {
			assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		}

		/* Verify the end of the archive. */
		/* Archive must be long enough to capture a 512-byte
		 * block of zeroes after the entry.  (POSIX requires a
		 * second block of zeros to be written but libarchive
		 * does not return an error if it can't consume
		 * it.) */
		if (i < 1536 + 512*((filedata_size + 511)/512) + 512) {
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_read_next_header(a, &ae));
		} else {
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
		}
	wrap_up2:
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}

	/* Now, damage the archive in various ways and test the responses. */

	/* Damage the first size field in the pax attributes. */
	memcpy(buff2, buff, buff_size);
	buff2[512] = '9';
	buff2[513] = '9';
	buff2[514] = 'A'; /* Non-digit in size. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Damage the size field in the pax attributes. */
	memcpy(buff2, buff, buff_size);
	buff2[512] = 'A'; /* First character not a digit. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Damage the size field in the pax attributes. */
	memcpy(buff2, buff, buff_size);
	for (i = 512; i < 520; i++) /* Size over 999999. */
		buff2[i] = '9';
	buff2[i] = ' ';
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Damage the size field in the pax attributes. */
	memcpy(buff2, buff, buff_size);
	buff2[512] = '9'; /* Valid format, but larger than attribute area. */
	buff2[513] = '9';
	buff2[514] = '9';
	buff2[515] = ' ';
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Damage the size field in the pax attributes. */
	memcpy(buff2, buff, buff_size);
	buff2[512] = '1'; /* Too small. */
	buff2[513] = ' ';
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Damage the size field in the pax attributes. */
	memcpy(buff2, buff, buff_size);
	buff2[512] = ' '; /* No size given. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Damage the ustar header. */
	memcpy(buff2, buff, buff_size);
	buff2[1024]++; /* Break the checksum. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff2, used));
	assertEqualIntA(a, ARCHIVE_FATAL, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * TODO: Damage the ustar header in various ways and fixup the
	 * checksum in order to test boundary cases in the innermost
	 * ustar header parsing.
	 */

	free(buff);
	free(buff2);
	free(filedata);
}